

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O2

void __thiscall QAction::setToolTip(QAction *this,QString *tooltip)

{
  QString *s1;
  QActionPrivate *this_00;
  bool bVar1;
  
  this_00 = *(QActionPrivate **)&this->field_0x8;
  s1 = &this_00->tooltip;
  bVar1 = ::comparesEqual(s1,tooltip);
  if (bVar1) {
    return;
  }
  QString::operator=(s1,(QString *)tooltip);
  QActionPrivate::sendDataChanged(this_00);
  return;
}

Assistant:

void QAction::setToolTip(const QString &tooltip)
{
    Q_D(QAction);
    if (d->tooltip == tooltip)
        return;

    d->tooltip = tooltip;
    d->sendDataChanged();
}